

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O3

void amrex::WriteMultiLevelPlotfile
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  int ncomp;
  pointer pbVar1;
  pointer pcVar2;
  MultiFab *pMVar3;
  pointer ppMVar4;
  __uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
  factory;
  pointer pBVar5;
  bool bVar6;
  long *plVar7;
  string *psVar8;
  FabArray<amrex::FArrayBox> *this;
  size_type *psVar9;
  long lVar10;
  ulong uVar11;
  undefined4 in_register_00000034;
  string *psVar12;
  BoxArray *pBVar13;
  undefined8 *puVar14;
  long lVar15;
  FabArray<amrex::FArrayBox> *mf_00;
  pointer pbVar16;
  long lVar17;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *pVVar18;
  byte bVar19;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  string ed;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  string *local_170;
  string *local_168;
  string *local_160;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_158;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_150;
  undefined1 local_138 [32];
  pointer pbStack_118;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> local_e0;
  string *local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_a8;
  _Alloc_hider local_90;
  size_type local_88;
  char local_80 [16];
  _Alloc_hider local_70;
  size_type local_68;
  char local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  
  bVar19 = 0;
  local_170 = (string *)time;
  local_168 = (string *)level_steps;
  local_160 = (string *)geom;
  local_158 = mf;
  PreBuildDirectorHierarchy
            (plotfilename,(string *)CONCAT44(in_register_00000034,nlevels),nlevels,false);
  pbVar16 = (extra_dirs->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (extra_dirs->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar16 != pbVar1) {
    do {
      pcVar2 = (plotfilename->_M_dataplus)._M_p;
      local_198._M_unused._M_object = (string *)&local_188;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,pcVar2,pcVar2 + plotfilename->_M_string_length);
      std::__cxx11::string::append(local_198._M_pod_data);
      psVar12 = (string *)(pbVar16->_M_dataplus)._M_p;
      plVar7 = (long *)std::__cxx11::string::_M_append(local_198._M_pod_data,(ulong)psVar12);
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        local_138._16_8_ = *psVar9;
        local_138._24_8_ = plVar7[3];
        local_138._0_8_ = local_138 + 0x10;
      }
      else {
        local_138._16_8_ = *psVar9;
        local_138._0_8_ = (size_type *)*plVar7;
      }
      local_138._8_8_ = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((string *)local_198._M_unused._0_8_ != (string *)&local_188) {
        psVar12 = (string *)(local_188 + 1);
        operator_delete(local_198._M_unused._M_object,(ulong)psVar12);
      }
      PreBuildDirectorHierarchy((string *)local_138,psVar12,nlevels,false);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != pbVar1);
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  if (*(int *)(ParallelContext::frames + 0xc) == *(int *)(ParallelContext::frames + 0x10) + -1) {
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&local_150,(long)nlevels,(allocator_type *)local_138);
    pVVar18 = local_158;
    if (local_150.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_150.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
        super__Vector_impl_data._M_start &&
        -1 < (long)local_150.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_150.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
      lVar17 = 0x50;
      lVar15 = 0;
      do {
        pBVar5 = local_150.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pMVar3 = (pVVar18->
                 super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar15];
        pBVar13 = &(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
        puVar14 = (undefined8 *)
                  ((long)local_150.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar17 + -0x50);
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar14 = *(undefined8 *)&pBVar13->m_bat;
          pBVar13 = (BoxArray *)((long)pBVar13 + ((ulong)bVar19 * -2 + 1) * 8);
          puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
        }
        *(element_type **)
         ((long)local_150.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar17 + -8) =
             (pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((local_150.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar17),
                   &(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        *(element_type **)((long)&(pBVar5->m_bat).m_op + lVar17 + 4) =
             (pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
             m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pBVar5->m_bat).m_op + lVar17 + 0xc),
                   &(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                    m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        lVar15 = lVar15 + 1;
        lVar10 = ((long)local_150.
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_150.
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        lVar17 = lVar17 + 0x68;
      } while (lVar10 - lVar15 != 0 && lVar15 <= lVar10);
    }
    local_138._0_8_ = local_138 + 0x10;
    pcVar2 = (plotfilename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,pcVar2,pcVar2 + plotfilename->_M_string_length);
    pbStack_118 = (pointer)CONCAT44(pbStack_118._4_4_,nlevels);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector(&local_110,&local_150);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f8,
             &varnames->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              (&local_e0,(vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_160);
    local_c8 = local_170;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_c0,(vector<int,_std::allocator<int>_> *)local_168);
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
              (&local_a8,&ref_ratio->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>);
    local_90._M_p = local_80;
    pcVar2 = (versionName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + versionName->_M_string_length);
    local_70._M_p = local_60;
    pcVar2 = (levelPrefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + levelPrefix->_M_string_length);
    local_50._M_p = local_40;
    pcVar2 = (mfPrefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + mfPrefix->_M_string_length);
    bVar6 = AsyncOut::UseAsyncOut();
    if (bVar6) {
      local_188 = (code *)0x0;
      pcStack_180 = (code *)0x0;
      local_198._M_unused._M_object = (void *)0x0;
      local_198._8_8_ = 0;
      psVar8 = (string *)operator_new(0x108);
      *(string **)psVar8 = psVar8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                (psVar8,local_138._0_8_,
                 (pointer)((long)(_func_int ***)local_138._8_8_ + local_138._0_8_));
      *(int *)(psVar8 + 0x20) = (int)pbStack_118;
      *(pointer *)(psVar8 + 0x28) =
           local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)(psVar8 + 0x30) =
           local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)(psVar8 + 0x38) =
           local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(psVar8 + 0x40),&local_f8);
      local_160 = psVar8 + 0x40;
      std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
                ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)(psVar8 + 0x58),
                 &local_e0);
      *(string **)(psVar8 + 0x70) = local_c8;
      local_168 = psVar8 + 0x58;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(psVar8 + 0x78),&local_c0);
      local_170 = psVar8 + 0x78;
      std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
                ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)(psVar8 + 0x90),
                 &local_a8);
      *(string **)(psVar8 + 0xa8) = psVar8 + 0xb8;
      std::__cxx11::string::_M_construct<char*>
                (psVar8 + 0xa8,local_90._M_p,local_90._M_p + local_88);
      *(string **)(psVar8 + 200) = psVar8 + 0xd8;
      std::__cxx11::string::_M_construct<char*>(psVar8 + 200,local_70._M_p,local_70._M_p + local_68)
      ;
      *(string **)(psVar8 + 0xe8) = psVar8 + 0xf8;
      std::__cxx11::string::_M_construct<char*>
                (psVar8 + 0xe8,local_50._M_p,local_50._M_p + local_48);
      pcStack_180 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp:196:18)>
                    ::_M_invoke;
      local_188 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp:196:18)>
                  ::_M_manager;
      local_198._M_unused._0_8_ = (undefined8)psVar8;
      AsyncOut::Submit((function<void_()> *)&local_198);
      if (local_188 != (code *)0x0) {
        (*local_188)(&local_198,&local_198,__destroy_functor);
      }
    }
    else {
      WriteMultiLevelPlotfile::anon_class_264_11_18691074::operator()
                ((anon_class_264_11_18691074 *)local_138);
    }
    WriteMultiLevelPlotfile(std::__cxx11::string_const&,int,amrex::Vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>>const&,amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,amrex::Vector<amrex::Geometry,std::allocator<amrex::Geometry>>const&,double,amrex::Vector<int,std::allocator<int>>const&,amrex::Vector<amrex::IntVect,std::allocator<amrex::IntVect>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
    ::$_0::~__0((__0 *)local_138);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_150);
  }
  if (0 < nlevels) {
    uVar11 = 0;
    pVVar18 = local_158;
    do {
      bVar6 = AsyncOut::UseAsyncOut();
      ppMVar4 = (pVVar18->
                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      mf_00 = &ppMVar4[uVar11]->super_FabArray<amrex::FArrayBox>;
      if (bVar6) {
        MultiFabFileFullPrefix((string *)local_138,(int)uVar11,plotfilename,levelPrefix,mfPrefix);
        VisMF::AsyncWrite(mf_00,(string *)local_138,true);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
      }
      else {
        if ((*(long *)(mf_00->super_FabArrayBase).n_grow.vect == 0) &&
           ((mf_00->super_FabArrayBase).n_grow.vect[2] == 0)) {
          this = (FabArray<amrex::FArrayBox> *)0x0;
        }
        else {
          ncomp = (mf_00->super_FabArrayBase).n_comp;
          local_138._0_8_ = (pointer)0x1;
          local_138._24_8_ = 0;
          pbStack_118 = (pointer)0x0;
          local_138._8_8_ = (Arena *)0x0;
          local_138._16_8_ = 0;
          factory.
          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
               (ppMVar4[uVar11]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          ;
          this = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
          MultiFab::MultiFab((MultiFab *)this,&(mf_00->super_FabArrayBase).boxarray,
                             &(mf_00->super_FabArrayBase).distributionMap,ncomp,0,
                             (MFInfo *)local_138,
                             (FabFactory<amrex::FArrayBox> *)
                             factory.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_138 + 0x10));
          pVVar18 = local_158;
          pMVar3 = (local_158->
                   super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                   super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11];
          MultiFab::Copy((MultiFab *)this,pMVar3,0,0,
                         (pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0);
          mf_00 = this;
        }
        MultiFabFileFullPrefix((string *)local_138,(int)uVar11,plotfilename,levelPrefix,mfPrefix);
        VisMF::Write(mf_00,(string *)local_138,NFiles,false);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
        if (this != (FabArray<amrex::FArrayBox> *)0x0) {
          (*(((FabArray<amrex::FArrayBox> *)&this->super_FabArrayBase)->super_FabArrayBase).
            _vptr_FabArrayBase[1])(this);
        }
      }
      uVar11 = uVar11 + 1;
    } while ((uint)nlevels != uVar11);
  }
  return;
}

Assistant:

void
WriteMultiLevelPlotfile (const std::string& plotfilename, int nlevels,
                         const Vector<const MultiFab*>& mf,
                         const Vector<std::string>& varnames,
                         const Vector<Geometry>& geom, Real time,
                         const Vector<int>& level_steps,
                         const Vector<IntVect>& ref_ratio,
                         const std::string &versionName,
                         const std::string &levelPrefix,
                         const std::string &mfPrefix,
                         const Vector<std::string>& extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    BL_ASSERT(nlevels <= mf.size());
    BL_ASSERT(nlevels <= geom.size());
    BL_ASSERT(nlevels <= ref_ratio.size()+1);
    BL_ASSERT(nlevels <= level_steps.size());
    BL_ASSERT(mf[0]->nComp() == varnames.size());

    int finest_level = nlevels-1;

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::MyProc() == ParallelDescriptor::NProcs()-1) {
        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        auto f = [=]() {
            VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
            std::string HeaderFileName(plotfilename + "/Header");
            std::ofstream HeaderFile;
            HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) FileOpenFailed(HeaderFileName);
            WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, varnames,
                                       geom, time, level_steps, ref_ratio, versionName,
                                       levelPrefix, mfPrefix);
        };

        if (AsyncOut::UseAsyncOut()) {
            AsyncOut::Submit(std::move(f));
        } else {
            f();
        }
    }

    for (int level = 0; level <= finest_level; ++level)
    {
        if (AsyncOut::UseAsyncOut()) {
            VisMF::AsyncWrite(*mf[level],
                              MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix),
                              true);
        } else {
            const MultiFab* data;
            std::unique_ptr<MultiFab> mf_tmp;
            if (mf[level]->nGrowVect() != 0) {
                mf_tmp = std::make_unique<MultiFab>(mf[level]->boxArray(),
                                                    mf[level]->DistributionMap(),
                                                    mf[level]->nComp(), 0, MFInfo(),
                                                    mf[level]->Factory());
                MultiFab::Copy(*mf_tmp, *mf[level], 0, 0, mf[level]->nComp(), 0);
                data = mf_tmp.get();
            } else {
                data = mf[level];
            }
            VisMF::Write(*data, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
        }
    }
}